

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gotcha_utils.c
# Opt level: O0

void gotcha_init(void)

{
  if (gotcha_init::gotcha_initialized == 0) {
    gotcha_init::gotcha_initialized = 1;
    debug_init();
    setup_hash_tables();
    handle_libdl();
  }
  return;
}

Assistant:

void gotcha_init() {
  static int gotcha_initialized = 0;
  if (gotcha_initialized) {
    return;
  }
  gotcha_initialized = 1;
  debug_init();
  setup_hash_tables();
  handle_libdl();
}